

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseEmitter::onAttach(BaseEmitter *this,CodeHolder *code)

{
  OperandSignature *pOVar1;
  byte *pbVar2;
  undefined8 *in_RSI;
  Array<asmjit::v1_14::OperandSignature,_32UL> *in_RDI;
  RegType nativeRegType;
  ArchTraits *archTraits;
  RegType *in_stack_ffffffffffffff58;
  
  *(undefined8 **)(in_RDI->_data + 0xc) = in_RSI;
  *(undefined8 *)(in_RDI->_data + 0x12) = *in_RSI;
  pbVar2 = (byte *)((long)&in_RDI->_data[2]._bits + 1);
  *pbVar2 = *pbVar2 | 1;
  pOVar1 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::operator[]<asmjit::v1_14::RegType>
                     (in_RDI,in_stack_ffffffffffffff58);
  in_RDI->_data[0x14]._bits = pOVar1->_bits;
  (**(code **)(*(long *)in_RDI->_data + 0x90))();
  return 0;
}

Assistant:

Error BaseEmitter::onAttach(CodeHolder* code) noexcept {
  _code = code;
  _environment = code->environment();
  _addEmitterFlags(EmitterFlags::kAttached);

  const ArchTraits& archTraits = ArchTraits::byArch(code->arch());
  RegType nativeRegType = Environment::is32Bit(code->arch()) ? RegType::kGp32 : RegType::kGp64;
  _gpSignature = archTraits.regTypeToSignature(nativeRegType);

  onSettingsUpdated();
  return kErrorOk;
}